

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

OneHotEncoder * __thiscall CoreML::Specification::Model::mutable_onehotencoder(Model *this)

{
  OneHotEncoder *this_00;
  
  if (this->_oneof_case_[0] == 600) {
    this_00 = (OneHotEncoder *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 600;
    this_00 = (OneHotEncoder *)operator_new(0x28);
    OneHotEncoder::OneHotEncoder(this_00);
    (this->Type_).onehotencoder_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::OneHotEncoder* Model::mutable_onehotencoder() {
  if (!has_onehotencoder()) {
    clear_Type();
    set_has_onehotencoder();
    Type_.onehotencoder_ = new ::CoreML::Specification::OneHotEncoder;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.oneHotEncoder)
  return Type_.onehotencoder_;
}